

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_write.cpp
# Opt level: O2

void __thiscall UniValue::writeArray(UniValue *this,uint prettyIndent,uint indentLevel,string *s)

{
  pointer pUVar1;
  uint uVar2;
  
  std::__cxx11::string::append((char *)s);
  if (prettyIndent != 0) {
    std::__cxx11::string::append((char *)s);
  }
  uVar2 = 0;
  while( true ) {
    pUVar1 = (this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pUVar1) / 0x58) <=
        (ulong)uVar2) break;
    if (prettyIndent != 0) {
      indentStr(prettyIndent,indentLevel,s);
      pUVar1 = (this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    write_abi_cxx11_((UniValue *)&stack0xffffffffffffffb0,uVar2 * 0x58 + (int)pUVar1,
                     (void *)(ulong)prettyIndent,(ulong)(indentLevel + 1));
    std::__cxx11::string::append((string *)s);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
    if (((long)(this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_finish -
        (long)(this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start) / 0x58 - 1U != (ulong)uVar2) {
      std::__cxx11::string::append((char *)s);
    }
    if (prettyIndent != 0) {
      std::__cxx11::string::append((char *)s);
    }
    uVar2 = uVar2 + 1;
  }
  if (prettyIndent != 0) {
    indentStr(prettyIndent,indentLevel - 1,s);
  }
  std::__cxx11::string::append((char *)s);
  return;
}

Assistant:

void UniValue::writeArray(unsigned int prettyIndent, unsigned int indentLevel, std::string& s) const
{
    s += "[";
    if (prettyIndent)
        s += "\n";

    for (unsigned int i = 0; i < values.size(); i++) {
        if (prettyIndent)
            indentStr(prettyIndent, indentLevel, s);
        s += values[i].write(prettyIndent, indentLevel + 1);
        if (i != (values.size() - 1)) {
            s += ",";
        }
        if (prettyIndent)
            s += "\n";
    }

    if (prettyIndent)
        indentStr(prettyIndent, indentLevel - 1, s);
    s += "]";
}